

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferMapTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::BufferMapExplicitFlushCase::iterate(BufferMapExplicitFlushCase *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  deUint32 seed;
  deUint32 buffer;
  GLenum GVar2;
  int iVar3;
  int iVar4;
  void *__dest;
  TestError *this_01;
  char *description;
  uint uVar5;
  uint uVar6;
  byte bVar7;
  BufferVerifier verifier;
  ReferenceBuffer refBuf;
  BufferVerifier local_50;
  ReferenceBuffer local_48;
  
  seed = deStringHash((this->super_BufferCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                     );
  local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (deUint8 *)0x0;
  local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deqp::gls::BufferTestUtil::BufferVerifier::BufferVerifier
            (&local_50,(this->super_BufferCase).m_renderCtx,
             ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
             this->m_verify);
  bVar1 = this->m_partialWrite;
  uVar5 = 0x60;
  if (bVar1 == false) {
    uVar5 = 0x1d9;
  }
  uVar6 = 0x1f7;
  if (bVar1 == false) {
    uVar6 = bVar1 + 0x1d9;
  }
  deqp::gls::BufferTestUtil::ReferenceBuffer::setSize(&local_48,0x514);
  deqp::gls::BufferTestUtil::fillWithRandomBytes
            (local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start,0x514,seed);
  buffer = deqp::gls::BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  this_00 = &(this->super_BufferCase).super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(this_00,this->m_bufferTarget,buffer);
  glu::CallLogWrapper::glBufferData
            (this_00,this->m_bufferTarget,0x514,
             local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start,this->m_usage);
  deqp::gls::BufferTestUtil::fillWithRandomBytes
            (local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start + 200,0x3f3,seed & 0xabcdef);
  __dest = glu::CallLogWrapper::glMapBufferRange(this_00,this->m_bufferTarget,200,0x3f3,0x12);
  GVar2 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar2,"glMapBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                  ,0x171);
  if (__dest != (void *)0x0) {
    memcpy(__dest,local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start + 200,0x3f3);
    glu::CallLogWrapper::glFlushMappedBufferRange
              (this_00,this->m_bufferTarget,(ulong)bVar1,(ulong)uVar5);
    GVar2 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar2,"glFlushMappedBufferRange",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                    ,0x177);
    glu::CallLogWrapper::glFlushMappedBufferRange
              (this_00,this->m_bufferTarget,(ulong)uVar6,(ulong)(0x3f3 - uVar6));
    GVar2 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar2,"glFlushMappedBufferRange",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                    ,0x179);
    glu::CallLogWrapper::glUnmapBuffer(this_00,this->m_bufferTarget);
    GVar2 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar2,"glUnmapBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                    ,0x17c);
    if (this->m_partialWrite == true) {
      iVar3 = deqp::gls::BufferTestUtil::BufferVerifier::verify
                        (&local_50,(EVP_PKEY_CTX *)(ulong)buffer,
                         local_48.m_data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,(ulong)(bVar1 | 200),(uchar *)(ulong)uVar5
                         ,(ulong)this->m_bufferTarget);
      iVar4 = deqp::gls::BufferTestUtil::BufferVerifier::verify
                        (&local_50,(EVP_PKEY_CTX *)(ulong)buffer,
                         local_48.m_data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,(ulong)(uVar6 + 200),
                         (uchar *)(ulong)(0x3f3 - uVar6),(ulong)this->m_bufferTarget);
      bVar7 = (byte)iVar3 & (byte)iVar4;
    }
    else {
      iVar3 = deqp::gls::BufferTestUtil::BufferVerifier::verify
                        (&local_50,(EVP_PKEY_CTX *)(ulong)buffer,
                         local_48.m_data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,200,(uchar *)0x3f3,
                         (ulong)this->m_bufferTarget);
      bVar7 = (byte)iVar3;
    }
    deqp::gls::BufferTestUtil::BufferCase::deleteBuffer(&this->super_BufferCase,buffer);
    description = "Buffer verification failed";
    if (bVar7 != 0) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx,(uint)(bVar7 ^ 1),
               description);
    deqp::gls::BufferTestUtil::BufferVerifier::~BufferVerifier(&local_50);
    if (local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_48.m_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.m_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.m_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return STOP;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,(char *)0x0,"ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
             ,0x172);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		deUint32		dataSeed		= deStringHash(getName());
		deUint32		buf				= 0;
		ReferenceBuffer	refBuf;
		BufferVerifier	verifier		(m_renderCtx, m_testCtx.getLog(), m_verify);
		const int		bufferSize		= 1300;
		const int		mapOffset		= 200;
		const int		mapSize			= 1011;
		const int		sliceAOffs		= m_partialWrite ? 1		: 0;
		const int		sliceASize		= m_partialWrite ? 96		: 473;
		const int		sliceBOffs		= m_partialWrite ? 503		: sliceAOffs+sliceASize;
		const int		sliceBSize		= mapSize-sliceBOffs;
		bool			isOk			= true;

		// Setup reference data.
		refBuf.setSize(bufferSize);
		fillWithRandomBytes(refBuf.getPtr(), bufferSize, dataSeed);

		buf = genBuffer();
		glBindBuffer(m_bufferTarget, buf);
		glBufferData(m_bufferTarget, bufferSize, refBuf.getPtr(), m_usage);

		// Do reference map.
		fillWithRandomBytes(refBuf.getPtr(mapOffset), mapSize, dataSeed&0xabcdef);

		void* ptr = glMapBufferRange(m_bufferTarget, mapOffset, mapSize, GL_MAP_WRITE_BIT|GL_MAP_FLUSH_EXPLICIT_BIT);
		GLU_CHECK_MSG("glMapBufferRange");
		TCU_CHECK(ptr);

		deMemcpy(ptr, refBuf.getPtr(mapOffset), mapSize);

		glFlushMappedBufferRange(m_bufferTarget, sliceAOffs, sliceASize);
		GLU_CHECK_MSG("glFlushMappedBufferRange");
		glFlushMappedBufferRange(m_bufferTarget, sliceBOffs, sliceBSize);
		GLU_CHECK_MSG("glFlushMappedBufferRange");

		glUnmapBuffer(m_bufferTarget);
		GLU_CHECK_MSG("glUnmapBuffer");

		if (m_partialWrite)
		{
			if (!verifier.verify(buf, refBuf.getPtr(), mapOffset+sliceAOffs, sliceASize, m_bufferTarget))
				isOk = false;

			if (!verifier.verify(buf, refBuf.getPtr(), mapOffset+sliceBOffs, sliceBSize, m_bufferTarget))
				isOk = false;
		}
		else
		{
			if (!verifier.verify(buf, refBuf.getPtr(), mapOffset, mapSize, m_bufferTarget))
				isOk = false;
		}

		deleteBuffer(buf);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Buffer verification failed");
		return STOP;
	}